

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

ConstTokenOrSyntax * __thiscall
slang::syntax::TransSetSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TransSetSyntax *this,size_t index)

{
  undefined4 uVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  if (index == 2) {
    uVar1._0_2_ = (this->closeParen).kind;
    uVar1._2_1_ = (this->closeParen).field_0x2;
    uVar1._3_1_ = (this->closeParen).numFlags;
    uVar2 = (this->closeParen).rawLen;
    uVar3 = *(undefined4 *)&(this->closeParen).info;
    uVar4 = *(undefined4 *)((long)&(this->closeParen).info + 4);
  }
  else {
    if (index == 1) {
      *(SyntaxNode **)
       &(__return_storage_ptr__->
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           &(this->ranges).super_SyntaxListBase.super_SyntaxNode;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
       + 0x10) = '\x01';
      return __return_storage_ptr__;
    }
    if (index != 0) {
      ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
      return __return_storage_ptr__;
    }
    uVar1._0_2_ = (this->openParen).kind;
    uVar1._2_1_ = (this->openParen).field_0x2;
    uVar1._3_1_ = (this->openParen).numFlags;
    uVar2 = (this->openParen).rawLen;
    uVar3 = *(undefined4 *)&(this->openParen).info;
    uVar4 = *(undefined4 *)((long)&(this->openParen).info + 4);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar1;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar2;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar4;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = '\0';
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TransSetSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openParen;
        case 1: return &ranges;
        case 2: return closeParen;
        default: return nullptr;
    }
}